

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O3

LY_ERR lys_print_mem(char **strp,lys_module *module,LYS_OUTFORMAT format,uint32_t options)

{
  LY_ERR LVar1;
  ly_out *in_RAX;
  char *pcVar2;
  ly_out *out;
  ly_out *local_28;
  
  if (strp == (char **)0x0) {
    pcVar2 = "strp";
  }
  else {
    if (module != (lys_module *)0x0) {
      *strp = (char *)0x0;
      local_28 = in_RAX;
      LVar1 = ly_out_new_memory(strp,0,&local_28);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      LVar1 = lys_print_(local_28,module,format,options);
      return LVar1;
    }
    pcVar2 = "module";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_print_mem");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_mem(char **strp, const struct lys_module *module, LYS_OUTFORMAT format, uint32_t options)
{
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, strp, module, LY_EINVAL);

    /* init */
    *strp = NULL;

    LY_CHECK_RET(ly_out_new_memory(strp, 0, &out));
    return lys_print_(out, module, format, options);
}